

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_fixture.c
# Opt level: O2

REF_STATUS
ref_fixture_tet_brick_args_grid
          (REF_GRID_conflict *ref_grid_ptr,REF_MPI ref_mpi,REF_DBL x0,REF_DBL x1,REF_DBL y0,
          REF_DBL y1,REF_DBL z0,REF_DBL z1,REF_INT l,REF_INT m,REF_INT n)

{
  REF_GRID_conflict pRVar1;
  REF_NODE ref_node;
  REF_DBL *pRVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  int iVar11;
  undefined8 uVar12;
  int iVar13;
  ulong uVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  double dVar18;
  char *pcVar19;
  ulong uVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  ulong uVar24;
  int iVar25;
  int iVar26;
  ulong uVar27;
  ulong local_118;
  int local_110;
  REF_INT tri [4];
  REF_INT cell;
  ulong local_f0;
  double local_e8;
  ulong local_e0;
  REF_INT tet [4];
  int local_b0;
  int local_a0;
  int local_9c;
  ulong local_88;
  int local_64;
  REF_INT node;
  REF_NODE local_38;
  
  local_e8 = x1;
  uVar4 = ref_grid_create(ref_grid_ptr,ref_mpi);
  if (uVar4 == 0) {
    pRVar1 = *ref_grid_ptr;
    ref_node = pRVar1->node;
    if (pRVar1->mpi->id == 0) {
      local_64 = l + -1;
      local_e8 = (local_e8 - x0) / (double)local_64;
      iVar5 = n + -1;
      local_e0 = 0;
      uVar27 = 0;
      if (0 < l) {
        uVar27 = (ulong)(uint)l;
      }
      iVar15 = 0;
      if (0 < m) {
        iVar15 = m;
      }
      iVar16 = 0;
      if (0 < n) {
        iVar16 = n;
      }
      uVar4 = m * l;
      uVar20 = (ulong)uVar4;
      local_f0 = (ulong)(uint)l;
      for (iVar11 = 0; iVar11 != iVar16; iVar11 = iVar11 + 1) {
        uVar14 = local_e0;
        for (iVar7 = 0; iVar7 != iVar15; iVar7 = iVar7 + 1) {
          for (uVar24 = 0; uVar27 != uVar24; uVar24 = uVar24 + 1) {
            uVar6 = ref_node_add(ref_node,(long)((int)uVar14 + (int)uVar24),&node);
            if (uVar6 != 0) {
              uVar27 = (ulong)uVar6;
              pcVar19 = "node";
              uVar12 = 0x66b;
              goto LAB_0013212f;
            }
            pRVar2 = ref_node->real;
            lVar10 = (long)node;
            pRVar2[lVar10 * 0xf] = (double)(int)uVar24 * local_e8 + x0;
            pRVar2[lVar10 * 0xf + 1] = (double)iVar7 * ((y1 - y0) / (double)(m + -1)) + y0;
            pRVar2[lVar10 * 0xf + 2] = (double)iVar11 * ((z1 - z0) / (double)iVar5) + z0;
          }
          uVar14 = uVar14 + (uint)l;
        }
        local_e0 = local_e0 + uVar20;
      }
      local_e0 = (ulong)(m + 1U);
      iVar16 = (int)local_f0 * (m + 1U);
      iVar11 = 0;
      uVar14 = local_f0 & 0xffffffff;
      uVar27 = local_f0;
      local_38 = ref_node;
      for (iVar15 = 1; iVar25 = 1, uVar24 = uVar20, local_88 = uVar14, iVar7 = iVar16,
          iVar13 = iVar11, iVar15 < n; iVar15 = iVar15 + 1) {
        for (; iVar25 < m; iVar25 = iVar25 + 1) {
          dVar18 = 0.0;
          while( true ) {
            iVar3 = SUB84(dVar18,0);
            iVar9 = (int)uVar24;
            iVar23 = (int)local_88;
            if ((int)local_f0 <= (int)(iVar3 + 1U)) break;
            tet[0] = iVar13 + iVar3;
            iVar21 = iVar13 + iVar3 + 1;
            iVar8 = iVar23 + iVar3;
            iVar17 = iVar9 + iVar3;
            local_e8 = dVar18;
            tet[1] = iVar21;
            tet[2] = iVar8;
            tet[3] = iVar17;
            uVar6 = ref_cell_add(pRVar1->cell[8],tet,&cell);
            if (uVar6 != 0) {
              uVar27 = (ulong)uVar6;
              pcVar19 = "tet";
              uVar12 = 0x683;
              goto LAB_0013212f;
            }
            iVar9 = iVar9 + SUB84(local_e8,0) + 1;
            tet[0] = iVar21;
            tet[1] = iVar8;
            tet[2] = iVar17;
            tet[3] = iVar9;
            uVar6 = ref_cell_add(pRVar1->cell[8],tet,&cell);
            if (uVar6 != 0) {
              uVar27 = (ulong)uVar6;
              pcVar19 = "tet";
              uVar12 = 0x688;
              goto LAB_0013212f;
            }
            iVar22 = SUB84(local_e8,0);
            iVar26 = iVar22 + iVar7;
            tet[0] = iVar8;
            tet[1] = iVar17;
            tet[2] = iVar9;
            tet[3] = iVar26;
            uVar6 = ref_cell_add(pRVar1->cell[8],tet,&cell);
            if (uVar6 != 0) {
              uVar27 = (ulong)uVar6;
              pcVar19 = "tet";
              uVar12 = 0x68d;
              goto LAB_0013212f;
            }
            iVar23 = iVar22 + iVar23 + 1;
            tet[0] = iVar21;
            tet[1] = iVar23;
            tet[2] = iVar8;
            tet[3] = iVar9;
            uVar6 = ref_cell_add(pRVar1->cell[8],tet,&cell);
            if (uVar6 != 0) {
              uVar27 = (ulong)uVar6;
              pcVar19 = "tet";
              uVar12 = 0x692;
              goto LAB_0013212f;
            }
            tet[0] = iVar23;
            tet[1] = iVar8;
            tet[2] = iVar9;
            tet[3] = iVar26;
            uVar6 = ref_cell_add(pRVar1->cell[8],tet,&cell);
            if (uVar6 != 0) {
              uVar27 = (ulong)uVar6;
              pcVar19 = "tet";
              uVar12 = 0x697;
              goto LAB_0013212f;
            }
            tet[3] = iVar7 + SUB84(local_e8,0) + 1;
            tet[0] = iVar23;
            tet[1] = iVar26;
            tet[2] = iVar9;
            uVar6 = ref_cell_add(pRVar1->cell[8],tet,&cell);
            uVar27 = (ulong)uVar6;
            dVar18 = (double)(ulong)(iVar3 + 1U);
            if (uVar6 != 0) {
              pcVar19 = "tet";
              uVar12 = 0x69c;
              goto LAB_0013212f;
            }
          }
          uVar27 = local_f0;
          uVar24 = (ulong)(uint)(iVar9 + (int)local_f0);
          local_88 = (ulong)(uint)(iVar23 + (int)local_f0);
          iVar7 = iVar7 + (int)local_f0;
          iVar13 = iVar13 + (int)local_f0;
        }
        uVar20 = (ulong)((int)uVar20 + uVar4);
        iVar11 = iVar11 + uVar4;
        iVar16 = iVar16 + uVar4;
        uVar14 = (ulong)((int)uVar14 + uVar4);
      }
      tri[3] = 1;
      local_e0 = (ulong)(uint)((int)local_e0 * (int)uVar27);
      iVar15 = 1;
      iVar16 = 0;
      while( true ) {
        local_e8 = (double)CONCAT44(local_e8._4_4_,iVar15);
        if (n <= iVar15) break;
        iVar11 = 0;
        iVar15 = iVar16;
        while (iVar11 = iVar11 + 1, iVar11 < m) {
          iVar7 = iVar15 + (int)local_f0;
          iVar13 = uVar4 + iVar15;
          tri[0] = iVar15;
          tri[1] = iVar7;
          tri[2] = iVar13;
          uVar6 = ref_cell_add(pRVar1->cell[3],tri,&cell);
          if (uVar6 != 0) {
            uVar27 = (ulong)uVar6;
            pcVar19 = "qua";
            uVar12 = 0x6ac;
            goto LAB_0013212f;
          }
          tri[1] = (int)local_e0 + iVar15;
          iVar15 = iVar15 + (int)local_f0;
          tri[0] = iVar7;
          tri[2] = iVar13;
          uVar6 = ref_cell_add(pRVar1->cell[3],tri,&cell);
          uVar27 = (ulong)uVar6;
          if (uVar6 != 0) {
            pcVar19 = "qua";
            uVar12 = 0x6b0;
            goto LAB_0013212f;
          }
        }
        iVar15 = local_e8._0_4_ + 1;
        iVar16 = iVar16 + uVar4;
      }
      tri[3] = 2;
      uVar6 = (int)local_e0 - 1;
      local_e8 = (double)CONCAT44(local_e8._4_4_,(m + 2) * (int)local_f0 + -1);
      local_b0 = (int)local_f0 * 2 + -1;
      for (local_110 = 1; local_e0 = (ulong)uVar6, local_110 < n; local_110 = local_110 + 1) {
        iVar11 = 0;
        local_118 = (ulong)local_e8 & 0xffffffff;
        uVar27 = local_e0;
        iVar15 = local_b0;
        iVar16 = local_64;
        while (iVar11 = iVar11 + 1, iVar11 < m) {
          iVar7 = (int)uVar27;
          tri[0] = iVar15;
          tri[1] = iVar16;
          tri[2] = iVar7;
          uVar6 = ref_cell_add(pRVar1->cell[3],tri,&cell);
          if (uVar6 != 0) {
            uVar27 = (ulong)uVar6;
            pcVar19 = "qua";
            uVar12 = 0x6c0;
            goto LAB_0013212f;
          }
          iVar13 = (int)local_f0;
          iVar16 = iVar16 + iVar13;
          uVar27 = (ulong)(uint)(iVar7 + iVar13);
          tri[2] = (int)local_118;
          local_118 = (ulong)(uint)((int)local_118 + iVar13);
          tri[0] = iVar15;
          tri[1] = iVar7;
          uVar6 = ref_cell_add(pRVar1->cell[3],tri,&cell);
          iVar15 = iVar15 + iVar13;
          if (uVar6 != 0) {
            uVar27 = (ulong)uVar6;
            pcVar19 = "qua";
            uVar12 = 0x6c4;
            goto LAB_0013212f;
          }
        }
        uVar6 = (int)local_e0 + uVar4;
        local_64 = local_64 + uVar4;
        local_e8 = (double)CONCAT44(local_e8._4_4_,local_e8._0_4_ + uVar4);
        local_b0 = local_b0 + uVar4;
      }
      tri[3] = 3;
      local_118._0_4_ = 0;
      for (local_110 = 1; local_110 < n; local_110 = local_110 + 1) {
        iVar15 = 1;
        iVar16 = (int)local_118;
        while (iVar15 < (int)local_f0) {
          iVar11 = iVar16 + 1;
          tri[0] = iVar11;
          tri[1] = iVar16;
          tri[2] = uVar4 + iVar16;
          uVar6 = ref_cell_add(pRVar1->cell[3],tri,&cell);
          if (uVar6 != 0) {
            uVar27 = (ulong)uVar6;
            pcVar19 = "qua";
            uVar12 = 0x6d4;
            goto LAB_0013212f;
          }
          tri[2] = uVar4 + iVar16 + 1;
          tri[0] = iVar11;
          tri[1] = uVar4 + iVar16;
          uVar6 = ref_cell_add(pRVar1->cell[3],tri,&cell);
          iVar15 = iVar15 + 1;
          iVar16 = iVar11;
          if (uVar6 != 0) {
            uVar27 = (ulong)uVar6;
            pcVar19 = "qua";
            uVar12 = 0x6d8;
            goto LAB_0013212f;
          }
        }
        local_118._0_4_ = (int)local_118 + uVar4;
      }
      tri[3] = 4;
      iVar15 = (int)local_f0;
      local_9c = (m + -1) * iVar15;
      local_110 = (m * 2 + -1) * iVar15;
      local_e8 = (double)CONCAT44(local_e8._4_4_,m * iVar15);
      for (local_118._0_4_ = 1; (int)local_118 < n; local_118._0_4_ = (int)local_118 + 1) {
        iVar15 = 1;
        iVar16 = local_9c;
        iVar11 = local_110;
        while (iVar15 < (int)local_f0) {
          iVar7 = iVar16 + 1;
          tri[0] = iVar16;
          tri[1] = iVar7;
          tri[2] = iVar11;
          uVar6 = ref_cell_add(pRVar1->cell[3],tri,&cell);
          if (uVar6 != 0) {
            uVar27 = (ulong)uVar6;
            pcVar19 = "qua";
            uVar12 = 0x6e8;
            goto LAB_0013212f;
          }
          tri[0] = iVar7;
          tri[1] = iVar11 + 1;
          tri[2] = iVar11;
          uVar6 = ref_cell_add(pRVar1->cell[3],tri,&cell);
          iVar15 = iVar15 + 1;
          iVar16 = iVar7;
          iVar11 = iVar11 + 1;
          if (uVar6 != 0) {
            uVar27 = (ulong)uVar6;
            pcVar19 = "qua";
            uVar12 = 0x6ec;
            goto LAB_0013212f;
          }
        }
        local_110 = local_110 + local_e8._0_4_;
        local_9c = local_9c + local_e8._0_4_;
      }
      tri[3] = 5;
      local_118._0_4_ = 0;
      for (local_110 = 1; local_110 < m; local_110 = local_110 + 1) {
        iVar15 = 1;
        iVar16 = (int)local_118;
        while (iVar15 < (int)local_f0) {
          iVar11 = iVar16 + 1;
          iVar7 = (int)local_f0 + iVar16;
          tri[0] = iVar16;
          tri[1] = iVar11;
          tri[2] = iVar7;
          uVar6 = ref_cell_add(pRVar1->cell[3],tri,&cell);
          if (uVar6 != 0) {
            uVar27 = (ulong)uVar6;
            pcVar19 = "qua";
            uVar12 = 0x6fc;
            goto LAB_0013212f;
          }
          tri[1] = (int)local_f0 + iVar16 + 1;
          tri[0] = iVar11;
          tri[2] = iVar7;
          uVar6 = ref_cell_add(pRVar1->cell[3],tri,&cell);
          iVar15 = iVar15 + 1;
          iVar16 = iVar11;
          if (uVar6 != 0) {
            uVar27 = (ulong)uVar6;
            pcVar19 = "qua";
            uVar12 = 0x700;
            goto LAB_0013212f;
          }
        }
        local_118._0_4_ = (int)local_118 + (int)local_f0;
      }
      tri[3] = 6;
      local_110 = uVar4 * iVar5;
      local_a0 = (iVar5 * m + 1) * (int)local_f0;
      for (local_118._0_4_ = 1; (int)local_118 < m; local_118._0_4_ = (int)local_118 + 1) {
        iVar5 = 1;
        iVar15 = local_110;
        iVar16 = local_a0;
        while (iVar5 < (int)local_f0) {
          iVar11 = iVar15 + 1;
          tri[0] = iVar11;
          tri[1] = iVar15;
          tri[2] = iVar16;
          uVar6 = ref_cell_add(pRVar1->cell[3],tri,&cell);
          if (uVar6 != 0) {
            uVar27 = (ulong)uVar6;
            pcVar19 = "qua";
            uVar12 = 0x710;
            goto LAB_0013212f;
          }
          tri[0] = iVar11;
          tri[1] = iVar16;
          tri[2] = iVar16 + 1;
          uVar6 = ref_cell_add(pRVar1->cell[3],tri,&cell);
          uVar27 = (ulong)uVar6;
          iVar5 = iVar5 + 1;
          iVar15 = iVar11;
          iVar16 = iVar16 + 1;
          if (uVar6 != 0) {
            pcVar19 = "qua";
            uVar12 = 0x714;
            goto LAB_0013212f;
          }
        }
        local_a0 = local_a0 + (int)local_f0;
        local_110 = local_110 + (int)local_f0;
      }
      uVar4 = ref_node_initialize_n_global(local_38,(long)(int)(uVar4 * n));
      if (uVar4 == 0) {
        return 0;
      }
      uVar27 = (ulong)uVar4;
      pcVar19 = "init glob";
      uVar12 = 0x717;
    }
    else {
      uVar4 = ref_node_initialize_n_global(ref_node,(long)(m * l * n));
      if (uVar4 == 0) {
        return 0;
      }
      uVar27 = (ulong)uVar4;
      pcVar19 = "init glob";
      uVar12 = 0x661;
    }
  }
  else {
    uVar27 = (ulong)uVar4;
    pcVar19 = "create";
    uVar12 = 0x65c;
  }
LAB_0013212f:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",uVar12,
         "ref_fixture_tet_brick_args_grid",uVar27,pcVar19);
  return (REF_STATUS)uVar27;
}

Assistant:

REF_FCN REF_STATUS ref_fixture_tet_brick_args_grid(
    REF_GRID *ref_grid_ptr, REF_MPI ref_mpi, REF_DBL x0, REF_DBL x1, REF_DBL y0,
    REF_DBL y1, REF_DBL z0, REF_DBL z1, REF_INT l, REF_INT m, REF_INT n) {
  REF_GRID ref_grid;
  REF_NODE ref_node;
  REF_INT global, node, hex[8], tet[4], cell;
  REF_INT quad[5], tri[4];

  REF_INT i, j, k;
  REF_DBL dx, dy, dz;

  dx = (x1 - x0) / ((REF_DBL)(l - 1));
  dy = (y1 - y0) / ((REF_DBL)(m - 1));
  dz = (z1 - z0) / ((REF_DBL)(n - 1));

  RSS(ref_grid_create(ref_grid_ptr, ref_mpi), "create");
  ref_grid = *ref_grid_ptr;
  ref_node = ref_grid_node(ref_grid);

  if (!ref_mpi_once(ref_grid_mpi(ref_grid))) {
    RSS(ref_node_initialize_n_global(ref_node, l * m * n), "init glob");
    return REF_SUCCESS;
  }

#define ijk2node(i, j, k, l, m, n) ((i) + (j) * (l) + (k) * (l) * (m))

  for (k = 0; k < n; k++)
    for (j = 0; j < m; j++)
      for (i = 0; i < l; i++) {
        global = ijk2node(i, j, k, l, m, n);
        RSS(ref_node_add(ref_node, global, &node), "node");
        ref_node_xyz(ref_node, 0, node) = x0 + dx * (REF_DBL)i;
        ref_node_xyz(ref_node, 1, node) = y0 + dy * (REF_DBL)j;
        ref_node_xyz(ref_node, 2, node) = z0 + dz * (REF_DBL)k;
      }

#define ijk2hex(i, j, k, l, m, n, hex)                     \
  (hex)[0] = ijk2node((i)-1, (j)-1, (k)-1, (l), (m), (n)); \
  (hex)[1] = ijk2node((i), (j)-1, (k)-1, (l), (m), (n));   \
  (hex)[2] = ijk2node((i), (j), (k)-1, (l), (m), (n));     \
  (hex)[3] = ijk2node((i)-1, (j), (k)-1, (l), (m), (n));   \
  (hex)[4] = ijk2node((i)-1, (j)-1, (k), (l), (m), (n));   \
  (hex)[5] = ijk2node((i), (j)-1, (k), (l), (m), (n));     \
  (hex)[6] = ijk2node((i), (j), (k), (l), (m), (n));       \
  (hex)[7] = ijk2node((i)-1, (j), (k), (l), (m), (n));

  for (k = 1; k < n; k++)
    for (j = 1; j < m; j++)
      for (i = 1; i < l; i++) {
        ijk2hex(i, j, k, l, m, n, hex);
        tet[0] = hex[0];
        tet[1] = hex[1];
        tet[2] = hex[3];
        tet[3] = hex[4];
        RSS(ref_cell_add(ref_grid_tet(ref_grid), tet, &cell), "tet");
        tet[0] = hex[1];
        tet[1] = hex[3];
        tet[2] = hex[4];
        tet[3] = hex[5];
        RSS(ref_cell_add(ref_grid_tet(ref_grid), tet, &cell), "tet");
        tet[0] = hex[3];
        tet[1] = hex[4];
        tet[2] = hex[5];
        tet[3] = hex[7];
        RSS(ref_cell_add(ref_grid_tet(ref_grid), tet, &cell), "tet");
        tet[0] = hex[1];
        tet[1] = hex[2];
        tet[2] = hex[3];
        tet[3] = hex[5];
        RSS(ref_cell_add(ref_grid_tet(ref_grid), tet, &cell), "tet");
        tet[0] = hex[2];
        tet[1] = hex[3];
        tet[2] = hex[5];
        tet[3] = hex[7];
        RSS(ref_cell_add(ref_grid_tet(ref_grid), tet, &cell), "tet");
        tet[0] = hex[2];
        tet[1] = hex[7];
        tet[2] = hex[5];
        tet[3] = hex[6];
        RSS(ref_cell_add(ref_grid_tet(ref_grid), tet, &cell), "tet");
      }

  quad[4] = 1;
  tri[3] = quad[4];
  i = 1;
  for (k = 1; k < n; k++)
    for (j = 1; j < m; j++) {
      ijk2hex(i, j, k, l, m, n, hex);
      quad[0] = hex[0];
      quad[1] = hex[3];
      quad[2] = hex[7];
      quad[3] = hex[4];
      tri[0] = quad[0];
      tri[1] = quad[1];
      tri[2] = quad[3];
      RSS(ref_cell_add(ref_grid_tri(ref_grid), tri, &cell), "qua");
      tri[0] = quad[1];
      tri[1] = quad[2];
      tri[2] = quad[3];
      RSS(ref_cell_add(ref_grid_tri(ref_grid), tri, &cell), "qua");
    }

  quad[4] = 2;
  tri[3] = quad[4];
  i = l - 1;
  for (k = 1; k < n; k++)
    for (j = 1; j < m; j++) {
      ijk2hex(i, j, k, l, m, n, hex);
      quad[0] = hex[2];
      quad[1] = hex[1];
      quad[2] = hex[5];
      quad[3] = hex[6];
      tri[0] = quad[0];
      tri[1] = quad[1];
      tri[2] = quad[2];
      RSS(ref_cell_add(ref_grid_tri(ref_grid), tri, &cell), "qua");
      tri[0] = quad[0];
      tri[1] = quad[2];
      tri[2] = quad[3];
      RSS(ref_cell_add(ref_grid_tri(ref_grid), tri, &cell), "qua");
    }

  quad[4] = 3;
  tri[3] = quad[4];
  j = 1;
  for (k = 1; k < n; k++)
    for (i = 1; i < l; i++) {
      ijk2hex(i, j, k, l, m, n, hex);
      quad[0] = hex[1];
      quad[1] = hex[0];
      quad[2] = hex[4];
      quad[3] = hex[5];
      tri[0] = quad[0];
      tri[1] = quad[1];
      tri[2] = quad[2];
      RSS(ref_cell_add(ref_grid_tri(ref_grid), tri, &cell), "qua");
      tri[0] = quad[0];
      tri[1] = quad[2];
      tri[2] = quad[3];
      RSS(ref_cell_add(ref_grid_tri(ref_grid), tri, &cell), "qua");
    }

  quad[4] = 4;
  tri[3] = quad[4];
  j = m - 1;
  for (k = 1; k < n; k++)
    for (i = 1; i < l; i++) {
      ijk2hex(i, j, k, l, m, n, hex);
      quad[0] = hex[3];
      quad[1] = hex[2];
      quad[2] = hex[6];
      quad[3] = hex[7];
      tri[0] = quad[0];
      tri[1] = quad[1];
      tri[2] = quad[3];
      RSS(ref_cell_add(ref_grid_tri(ref_grid), tri, &cell), "qua");
      tri[0] = quad[1];
      tri[1] = quad[2];
      tri[2] = quad[3];
      RSS(ref_cell_add(ref_grid_tri(ref_grid), tri, &cell), "qua");
    }

  quad[4] = 5;
  tri[3] = quad[4];
  k = 1;
  for (j = 1; j < m; j++)
    for (i = 1; i < l; i++) {
      ijk2hex(i, j, k, l, m, n, hex);
      quad[0] = hex[0];
      quad[1] = hex[1];
      quad[2] = hex[2];
      quad[3] = hex[3];
      tri[0] = quad[0];
      tri[1] = quad[1];
      tri[2] = quad[3];
      RSS(ref_cell_add(ref_grid_tri(ref_grid), tri, &cell), "qua");
      tri[0] = quad[1];
      tri[1] = quad[2];
      tri[2] = quad[3];
      RSS(ref_cell_add(ref_grid_tri(ref_grid), tri, &cell), "qua");
    }

  quad[4] = 6;
  tri[3] = quad[4];
  k = n - 1;
  for (j = 1; j < m; j++)
    for (i = 1; i < l; i++) {
      ijk2hex(i, j, k, l, m, n, hex);
      quad[0] = hex[5];
      quad[1] = hex[4];
      quad[2] = hex[7];
      quad[3] = hex[6];
      tri[0] = quad[0];
      tri[1] = quad[1];
      tri[2] = quad[2];
      RSS(ref_cell_add(ref_grid_tri(ref_grid), tri, &cell), "qua");
      tri[0] = quad[0];
      tri[1] = quad[2];
      tri[2] = quad[3];
      RSS(ref_cell_add(ref_grid_tri(ref_grid), tri, &cell), "qua");
    }

  RSS(ref_node_initialize_n_global(ref_node, l * m * n), "init glob");

  return REF_SUCCESS;
}